

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O3

bool __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreeAllocation(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
              Allocation *object)

{
  Page *page;
  void *segment;
  ulong uVar1;
  char *pageAddress;
  CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this_00;
  code *pcVar2;
  bool bVar3;
  BVIndex index;
  BVIndex BVar4;
  undefined4 *puVar5;
  uint length;
  
  page = (object->field_0).page;
  segment = page->segment;
  length = 1;
  if (0x80 < object->size) {
    length = (uint)(object->size >> 7) & 0x1ffffff;
  }
  index = GetIndexInPage(this,page,object->address);
  BVar4 = BVUnitT<unsigned_long>::CountBit((page->freeBitVector).word);
  uVar1 = (page->freeBitVector).word;
  if ((uVar1 == 0xffffffffffffffff) ||
     (((0xffffffffffffffffU >> (-(char)length & 0x3fU)) << ((byte)index & 0x3f) & uVar1) != 0)) {
    CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
  }
  else {
    if (page->inFullList == true) {
      if (DAT_015bc46a == '\x01') {
        Output::Trace(CustomHeapPhase,
                      L"Recycling page 0x%p because address 0x%p of size %d was freed\n",
                      page->address,object->address,object->size);
      }
      if (object->size == 0x1000) {
        Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>::
        EnsureAllocationReadWrite<4u>
                  ((Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper> *)this,
                   object);
        if (object->address == (char *)0x0) {
          return false;
        }
        memset(object->address,0xcc,object->size);
        pageAddress = page->address;
        DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveElement<Memory::ArenaAllocator>
                  (this->fullPages + page->currentBucket,this->auxiliaryAllocator,page);
        this->totalAllocationSize = this->totalAllocationSize - 0x1000;
        ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  (&this->auxiliaryAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,object,
                   0x38);
        this_00 = this->codePageAllocators;
        CCLock::Enter((CCLock *)this_00);
        CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
        ReleasePages(this->codePageAllocators,pageAddress,1,segment);
        CCLock::Leave((CCLock *)this_00);
        if (DAT_015bc46a == '\x01') {
          Output::Trace(CustomHeapPhase,L"FastPath: freeing page-sized object directly\n");
          return true;
        }
        return true;
      }
      AddPageToBucket(this,page,page->currentBucket,true);
    }
    if (BVar4 != 0x40 - length) {
      Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>::
      EnsureAllocationReadWrite<64u>
                ((Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper> *)this,
                 object);
      FreeAllocationHelper(this,object,index,length);
      CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
      ProtectPages(this->codePageAllocators,page->address,1,segment,0x20,0x40);
      return true;
    }
    Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper>::
    EnsureAllocationReadWrite<4u>
              ((Heap<Memory::VirtualAllocWrapper,Memory::PreReservedVirtualAllocWrapper> *)this,
               object);
    FreeAllocationHelper(this,object,index,length);
    if ((page->freeBitVector).word != 0xffffffffffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                         ,0x373,"(page->IsEmpty())","page->IsEmpty()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveElement<Memory::ArenaAllocator>
              (this->buckets + page->currentBucket,this->auxiliaryAllocator,page);
  }
  return false;
}

Assistant:

bool Heap<TAlloc, TPreReservedAlloc>::FreeAllocation(Allocation* object)
{
    Page* page = object->page;
    void* segment = page->segment;
    size_t pageSize =  AutoSystemInfo::PageSize;

    unsigned int length = GetChunkSizeForBytes(object->size);
    BVIndex index = GetIndexInPage(page, object->address);

    uint freeBitsCount = page->freeBitVector.Count();

    // Make sure that the section under interest or the whole page has not already been freed
    if (page->IsEmpty() || page->freeBitVector.TestAnyInRange(index, length))
    {
        CustomHeap_BadPageState_unrecoverable_error((ULONG_PTR)this);
        return false;
    }

    if (page->inFullList)
    {
        VerboseHeapTrace(_u("Recycling page 0x%p because address 0x%p of size %d was freed\n"), page->address, object->address, object->size);
       
        // If the object being freed is equal to the page size, we're
        // going to remove it anyway so don't add it to a bucket
        if (object->size != pageSize)
        {
            AddPageToBucket(page, page->currentBucket, true);
        }
        else
        {
            EnsureAllocationWriteable(object);

            // Fill the old buffer with debug breaks
            char* localAddr = this->codePageAllocators->AllocLocal(object->address, object->size, page->segment);
            if (!localAddr)
            {
                MemoryOperationLastError::RecordError(JSERR_FatalMemoryExhaustion);
                return false;
            }
            FillDebugBreak((BYTE*)localAddr, object->size);
            this->codePageAllocators->FreeLocal(localAddr, page->segment);

            void* pageAddress = page->address;

            this->fullPages[page->currentBucket].RemoveElement(this->auxiliaryAllocator, page);            

            // The page is not in any bucket- just update the stats, free the allocation
            // and dump the page- we don't need to update free object size since the object
            // size is equal to the page size so they cancel each other out
#if DBG_DUMP
            this->totalAllocationSize -= pageSize;
#endif
            this->auxiliaryAllocator->Free(object, sizeof(Allocation));
            {
                AutoCriticalSection autoLock(&this->codePageAllocators->cs);
                this->codePageAllocators->ReleasePages(pageAddress, 1, segment);
            }
            VerboseHeapTrace(_u("FastPath: freeing page-sized object directly\n"));
            return true;
        }
    }

    // If the page is about to become empty then we should not need
    // to set it to executable and we don't expect to restore the
    // previous protection settings.
    if (freeBitsCount == BVUnit::BitsPerWord - length)
    {
        EnsureAllocationWriteable(object);
        FreeAllocationHelper(object, index, length);
        Assert(page->IsEmpty());

        this->buckets[page->currentBucket].RemoveElement(this->auxiliaryAllocator, page);
        return false;
    }
    else
    {
        EnsureAllocationExecuteWriteable(object);
        FreeAllocationHelper(object, index, length);

        // after freeing part of the page, the page should be in PAGE_EXECUTE_READWRITE protection, and turning to PAGE_EXECUTE_READ (always with TARGETS_NO_UPDATE state)

        DWORD protectFlags = 0;

        if (GlobalSecurityPolicy::IsCFGEnabled())
        {
            protectFlags = PAGE_EXECUTE_RO_TARGETS_NO_UPDATE;
        }
        else
        {
            protectFlags = PAGE_EXECUTE_READ;
        }

        this->codePageAllocators->ProtectPages(page->address, 1, segment, protectFlags, PAGE_EXECUTE_READWRITE);

        return true;
    }
}